

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginDataSegment
          (BinaryReaderIR *this,Index index,Index memory_index,uint8_t flags)

{
  char *pcVar1;
  Offset OVar2;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar3;
  size_t sVar4;
  tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_> tVar5;
  Location loc;
  __uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_a0;
  Location local_98;
  Var local_78;
  
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar4 = strlen(pcVar1);
  tVar5.
  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
        )operator_new(0xe0);
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 8) =
       0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x10)
       = 0;
  *(size_t *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x18) = sVar4
  ;
  *(char **)((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x20
            ) = pcVar1;
  *(Offset *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x28) = OVar2
  ;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x38) = 8;
  *(undefined ***)
   tVar5.
   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       &PTR__DataSegmentModuleField_00243928;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x40) = 0;
  *(long **)((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x48
            ) = (long *)((long)tVar5.
                               super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                               .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                               _M_head_impl + 0x58);
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x50)
       = 0;
  *(undefined1 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x58) = 0;
  Var::Var((Var *)((long)tVar5.
                         super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                         .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl
                  + 0x68));
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xd0)
       = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xd8)
       = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xc0)
       = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 200)
       = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xb0)
       = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xb8)
       = 0;
  pcVar1 = this->filename_;
  aVar3.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = strlen(pcVar1);
  local_98.filename._M_str = pcVar1;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar3.offset;
  Var::Var(&local_78,memory_index,&local_98);
  Var::operator=((Var *)((long)tVar5.
                               super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                               .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                               _M_head_impl + 0x68),&local_78);
  Var::~Var(&local_78);
  *(uint *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x40)
       = flags & 1;
  local_a0._M_t.
  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       (tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>)
       (tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>)
       tVar5.
       super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
       .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                       *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
       )local_a0._M_t.
        super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
        .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl !=
      (DataSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl
                + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginDataSegment(Index index,
                                        Index memory_index,
                                        uint8_t flags) {
  auto field = std::make_unique<DataSegmentModuleField>(GetLocation());
  DataSegment& data_segment = field->data_segment;
  data_segment.memory_var = Var(memory_index, GetLocation());
  if ((flags & SegPassive) == SegPassive) {
    data_segment.kind = SegmentKind::Passive;
  } else {
    data_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}